

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

VkImageCreateInfo *
vkt::tessellation::makeImageCreateInfo
          (VkImageCreateInfo *__return_storage_ptr__,IVec2 *size,VkFormat format,
          VkImageUsageFlags usage,deUint32 numArrayLayers)

{
  undefined8 uVar1;
  
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->imageType = VK_IMAGE_TYPE_2D;
  __return_storage_ptr__->format = format;
  uVar1 = *(undefined8 *)size->m_data;
  (__return_storage_ptr__->extent).width = (int)uVar1;
  (__return_storage_ptr__->extent).height = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->extent).depth = 0x100000001;
  __return_storage_ptr__->arrayLayers = numArrayLayers;
  __return_storage_ptr__->samples = VK_SAMPLE_COUNT_1_BIT;
  __return_storage_ptr__->tiling = VK_IMAGE_TILING_OPTIMAL;
  __return_storage_ptr__->usage = usage;
  __return_storage_ptr__->sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  __return_storage_ptr__->queueFamilyIndexCount = 0;
  __return_storage_ptr__->pQueueFamilyIndices = (deUint32 *)0x0;
  __return_storage_ptr__->initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  return __return_storage_ptr__;
}

Assistant:

VkImageCreateInfo makeImageCreateInfo (const tcu::IVec2& size, const VkFormat format, const VkImageUsageFlags usage, const deUint32 numArrayLayers)
{
	const VkImageCreateInfo imageInfo =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType          sType;
		DE_NULL,									// const void*              pNext;
		(VkImageCreateFlags)0,						// VkImageCreateFlags       flags;
		VK_IMAGE_TYPE_2D,							// VkImageType              imageType;
		format,										// VkFormat                 format;
		makeExtent3D(size.x(), size.y(), 1),		// VkExtent3D               extent;
		1u,											// uint32_t                 mipLevels;
		numArrayLayers,								// uint32_t                 arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits    samples;
		VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling            tiling;
		usage,										// VkImageUsageFlags        usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode            sharingMode;
		0u,											// uint32_t                 queueFamilyIndexCount;
		DE_NULL,									// const uint32_t*          pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout            initialLayout;
	};
	return imageInfo;
}